

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

AtomicNotify * __thiscall
wasm::Builder::makeAtomicNotify
          (Builder *this,Expression *ptr,Expression *notifyCount,Address offset,Name memory)

{
  AtomicNotify *pAVar1;
  AtomicNotify *notify;
  Expression *notifyCount_local;
  Expression *ptr_local;
  Builder *this_local;
  Name memory_local;
  Address offset_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  memory_local.super_IString.str._M_str = (char *)offset.addr;
  pAVar1 = MixedArena::alloc<wasm::AtomicNotify>(&this->wasm->allocator);
  (pAVar1->offset).addr = (address64_t)memory_local.super_IString.str._M_str;
  pAVar1->ptr = ptr;
  pAVar1->notifyCount = notifyCount;
  ::wasm::AtomicNotify::finalize();
  Name::operator=(&pAVar1->memory,(Name *)&this_local);
  return pAVar1;
}

Assistant:

AtomicNotify* makeAtomicNotify(Expression* ptr,
                                 Expression* notifyCount,
                                 Address offset,
                                 Name memory) {
    auto* notify = wasm.allocator.alloc<AtomicNotify>();
    notify->offset = offset;
    notify->ptr = ptr;
    notify->notifyCount = notifyCount;
    notify->finalize();
    notify->memory = memory;
    return notify;
  }